

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger array_reduce(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  long lVar3;
  SQObjectValue SVar4;
  bool bVar5;
  uint uVar6;
  SQDelegable *pSVar7;
  SQObjectPtr *pSVar8;
  SQInteger SVar9;
  SQObjectPtr *pSVar10;
  SQRESULT SVar11;
  long nidx;
  SQObjectPtr res;
  SQObjectPtr other;
  SQObjectPtr local_68;
  SQOuter *local_58;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  pSVar8 = SQVM::GetAt(v,v->_stackbase);
  local_58 = (pSVar8->super_SQObject)._unVal.pOuter;
  lVar3 = local_58->_idx;
  local_68.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_68.super_SQObject._type = OT_NULL;
  SVar9 = sq_gettop(v);
  if (SVar9 < 3) {
    if (lVar3 == 0) {
      SVar9 = 0;
      goto LAB_001279a0;
    }
    nidx = 1;
    SQArray::Get((SQArray *)local_58,0,&local_68);
  }
  else {
    pSVar10 = SQVM::GetAt(v,v->_stackbase + 2);
    SVar4 = (SQObjectValue)(pSVar10->super_SQObject)._unVal.pTable;
    SVar2 = (pSVar10->super_SQObject)._type;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &((SVar4.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    uVar6 = local_68.super_SQObject._type >> 0x1b;
    local_68.super_SQObject._type = SVar2;
    if ((uVar6 & 1) != 0) {
      pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        pSVar7 = &(local_68.super_SQObject._unVal.pTable)->super_SQDelegable;
        local_68.super_SQObject._unVal = SVar4;
        (*(pSVar7->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
        SVar4 = local_68.super_SQObject._unVal;
      }
    }
    local_68.super_SQObject._unVal = SVar4;
    nidx = 0;
  }
  if (nidx < lVar3) {
    local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_50.super_SQObject._type = OT_NULL;
    pSVar10 = SQVM::GetAt(v,v->_stackbase + 1);
    SQVM::Push(v,pSVar10);
    bVar5 = nidx < lVar3;
    if (nidx < lVar3) {
      do {
        SQArray::Get((SQArray *)local_58,nidx,&local_50);
        local_40.super_SQObject._type = (pSVar8->super_SQObject)._type;
        local_40.super_SQObject._unVal = (SQObjectValue)(pSVar8->super_SQObject)._unVal.pTable;
        if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        SQVM::Push(v,&local_40);
        SQObjectPtr::~SQObjectPtr(&local_40);
        SQVM::Push(v,&local_68);
        SQVM::Push(v,&local_50);
        SVar11 = sq_call(v,3,1,0);
        if (SVar11 < 0) {
          SQObjectPtr::~SQObjectPtr(&local_50);
          SVar9 = -1;
          goto LAB_001279a0;
        }
        pSVar10 = SQVM::GetUp(v,-1);
        SVar4 = (SQObjectValue)(pSVar10->super_SQObject)._unVal.pTable;
        SVar2 = (pSVar10->super_SQObject)._type;
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &((SVar4.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                    _uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        uVar6 = local_68.super_SQObject._type >> 0x1b;
        local_68.super_SQObject._type = SVar2;
        if ((uVar6 & 1) != 0) {
          pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            pSVar7 = &(local_68.super_SQObject._unVal.pTable)->super_SQDelegable;
            local_68.super_SQObject._unVal = SVar4;
            (*(pSVar7->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
            SVar4 = local_68.super_SQObject._unVal;
          }
        }
        local_68.super_SQObject._unVal = SVar4;
        SQVM::Pop(v);
        nidx = nidx + 1;
      } while (lVar3 != nidx);
      bVar5 = false;
    }
    SQVM::Pop(v);
    SQObjectPtr::~SQObjectPtr(&local_50);
    SVar9 = -1;
    if (bVar5) goto LAB_001279a0;
  }
  SVar9 = 1;
  SQVM::Push(v,&local_68);
LAB_001279a0:
  SQObjectPtr::~SQObjectPtr(&local_68);
  return SVar9;
}

Assistant:

static SQInteger array_reduce(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQArray *a = _array(o);
    SQInteger size = a->Size();
    SQObjectPtr res;
    SQInteger iterStart;
    if (sq_gettop(v)>2) {
        res = stack_get(v,3);
        iterStart = 0;
    } else if (size==0) {
        return 0;
    } else {
        a->Get(0,res);
        iterStart = 1;
    }
    if (size > iterStart) {
        SQObjectPtr other;
        v->Push(stack_get(v,2));
        for (SQInteger n = iterStart; n < size; n++) {
            a->Get(n,other);
            v->Push(o);
            v->Push(res);
            v->Push(other);
            if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
                return SQ_ERROR;
            }
            res = v->GetUp(-1);
            v->Pop();
        }
        v->Pop();
    }
    v->Push(res);
    return 1;
}